

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O3

void __thiscall VFS::CVFS::Copy(CVFS *this,string *From,string *To)

{
  pthread_mutex_t *__mutex;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar3;
  int iVar4;
  CVFSException *pCVar5;
  VFSNode VVar6;
  VFSNode copy;
  VFSNode DestNode;
  VFSNode node;
  string local_90;
  size_type local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  _Alloc_hider local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  _Alloc_hider local_40;
  _Alloc_hider local_38;
  
  bVar3 = NodeExists(this,From);
  if (!bVar3) {
    pCVar5 = (CVFSException *)__cxa_allocate_exception(0x30);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Can\'t copy node. Source node doesn\'t exists.","");
    CVFSException::CVFSException(pCVar5,&local_90,NODE_DOESNT_EXISTS);
    __cxa_throw(pCVar5,&CVFSException::typeinfo,CVFSException::~CVFSException);
  }
  bVar3 = NodeExists(this,To);
  if (!bVar3) {
    ExtractPath(&local_90,this,To);
    GetNodeInfo((CVFS *)&local_60,&this->MAGIC);
    paVar1 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_p = local_60._M_p;
    __mutex = (pthread_mutex_t *)(local_60._M_p + 0x40);
    iVar4 = pthread_mutex_lock(__mutex);
    if (iVar4 == 0) {
      bVar3 = (bool)_Var2._M_p[0x28];
      pthread_mutex_unlock(__mutex);
      if (bVar3 != false) {
        VVar6 = GetNodeInfo((CVFS *)&stack0xffffffffffffffc0,&this->MAGIC);
        this_00 = local_58;
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_58->_M_use_count = local_58->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_58->_M_use_count = local_58->_M_use_count + 1;
          }
        }
        (*(code *)**(undefined8 **)local_40._M_p)
                  (&local_70,local_40._M_p,
                   VVar6.super___shared_ptr<VFS::CVFSNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi._M_pi);
        ExtractName(&local_90,this,To);
        std::__cxx11::string::operator=((string *)(local_70 + 8),(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != paVar1) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        local_50._M_allocated_capacity = local_70;
        local_50._8_8_ = local_68;
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_68->_M_use_count = local_68->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_68->_M_use_count = local_68->_M_use_count + 1;
          }
        }
        CVFSDir::AppendChild((CVFSDir *)local_60._M_p,(VFSNode *)&local_50);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
        }
        if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p);
        }
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
        return;
      }
    }
    else {
      std::__throw_system_error(iVar4);
    }
    pCVar5 = (CVFSException *)__cxa_allocate_exception(0x30);
    local_90._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Can\'t copy node. Destination node parent is a file.","");
    CVFSException::CVFSException(pCVar5,&local_90,NODE_IS_FILE);
    __cxa_throw(pCVar5,&CVFSException::typeinfo,CVFSException::~CVFSException);
  }
  pCVar5 = (CVFSException *)__cxa_allocate_exception(0x30);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"Can\'t copy node. Destination node already exists.","");
  CVFSException::CVFSException(pCVar5,&local_90,NODE_ALREADY_EXISTS);
  __cxa_throw(pCVar5,&CVFSException::typeinfo,CVFSException::~CVFSException);
}

Assistant:

void Copy(const std::string &From, const std::string &To)
            {
                if(!NodeExists(From))
                    throw CVFSException("Can't copy node. Source node doesn't exists.", VFSError::NODE_DOESNT_EXISTS);

                if(NodeExists(To))
                    throw CVFSException("Can't copy node. Destination node already exists.", VFSError::NODE_ALREADY_EXISTS);

                auto DestNode = GetNodeInfo(ExtractPath(To));
                if(!DestNode->IsDir())
                    throw CVFSException("Can't copy node. Destination node parent is a file.", VFSError::NODE_IS_FILE);

                auto node = GetNodeInfo(From);
                auto DestParent = std::static_pointer_cast<CVFSDir>(DestNode);

                auto copy = node->Copy();
                copy->m_Name = ExtractName(To);

                DestParent->AppendChild(copy);
            }